

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utSortByPType.cpp
# Opt level: O3

void __thiscall
SortByPTypeProcessTest_SortByPTypeStep_Test::TestBody
          (SortByPTypeProcessTest_SortByPTypeStep_Test *this)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  long lVar4;
  aiMesh *paVar5;
  char *pcVar6;
  char *in_R9;
  ulong uVar7;
  long lVar8;
  internal iVar9;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  ScenePreprocessor s;
  AssertHelper local_a0;
  Message local_98;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  string local_88;
  AssertHelper local_68;
  aiMesh *local_60;
  SortByPTypeProcessTest_SortByPTypeStep_Test *local_58;
  uint local_4c;
  long local_48;
  uint (*local_40) [4];
  ScenePreprocessor local_38;
  
  local_38.scene = (this->super_SortByPTypeProcessTest).mScene;
  local_58 = this;
  Assimp::ScenePreprocessor::ProcessScene(&local_38);
  lVar4 = 0;
  do {
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              ((internal *)&local_88,"result[m]","mScene->mMeshes[m]->mPrimitiveTypes",
               (uint *)((long)::result + lVar4),
               *(uint **)((long)((local_58->super_SortByPTypeProcessTest).mScene)->mMeshes +
                         lVar4 * 2));
    if ((char)local_88._M_dataplus._M_p == '\0') {
      testing::Message::Message(&local_98);
      pcVar6 = "";
      if ((undefined8 *)local_88._M_string_length != (undefined8 *)0x0) {
        pcVar6 = *(char **)local_88._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utSortByPType.cpp"
                 ,0xb3,pcVar6);
      testing::internal::AssertHelper::operator=(&local_a0,&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      if (((CONCAT44(local_98.ss_.ptr_._4_4_,(int)local_98.ss_.ptr_) != 0) &&
          (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
         ((long *)CONCAT44(local_98.ss_.ptr_._4_4_,(int)local_98.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_98.ss_.ptr_._4_4_,(int)local_98.ss_.ptr_) + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_88._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0x28);
  (*(((local_58->super_SortByPTypeProcessTest).mProcess1)->super_BaseProcess)._vptr_BaseProcess[5])
            ();
  local_48 = 0;
  uVar3 = 0;
  do {
    local_40 = ::num + local_48;
    lVar4 = 0;
    do {
      uVar1 = (*local_40)[lVar4];
      if (uVar1 != 0) {
        iVar9 = (internal)(uVar3 < ((local_58->super_SortByPTypeProcessTest).mScene)->mNumMeshes);
        local_90.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_98.ss_.ptr_._0_1_ = iVar9;
        if (!(bool)iVar9) {
          testing::Message::Message((Message *)&local_a0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_88,(internal *)&local_98,(AssertionResult *)"real < mScene->mNumMeshes",
                     "false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_68,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utSortByPType.cpp"
                     ,0xbb,(char *)CONCAT71(local_88._M_dataplus._M_p._1_7_,
                                            (char)local_88._M_dataplus._M_p));
          testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_a0);
          testing::internal::AssertHelper::~AssertHelper(&local_68);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_88._M_dataplus._M_p._1_7_,(char)local_88._M_dataplus._M_p) !=
              &local_88.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_88._M_dataplus._M_p._1_7_,(char)local_88._M_dataplus._M_p
                                    ));
          }
          if (((local_a0.data_ != (AssertHelperData *)0x0) &&
              (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
             (local_a0.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_a0.data_ + 8))();
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_60 = ((local_58->super_SortByPTypeProcessTest).mScene)->mMeshes[uVar3];
        local_98.ss_.ptr_._0_4_ = CONCAT31(local_98.ss_.ptr_._1_3_,local_60 != (aiMesh *)0x0);
        local_90.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (local_60 == (aiMesh *)0x0) {
          testing::Message::Message((Message *)&local_a0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_88,(internal *)&local_98,(AssertionResult *)"NULL != mesh","false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_68,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utSortByPType.cpp"
                     ,0xbf,(char *)CONCAT71(local_88._M_dataplus._M_p._1_7_,
                                            (char)local_88._M_dataplus._M_p));
          testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_a0);
          testing::internal::AssertHelper::~AssertHelper(&local_68);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_88._M_dataplus._M_p._1_7_,(char)local_88._M_dataplus._M_p) !=
              &local_88.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_88._M_dataplus._M_p._1_7_,(char)local_88._M_dataplus._M_p
                                    ));
          }
          if (((local_a0.data_ != (AssertHelperData *)0x0) &&
              (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
             (local_a0.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_a0.data_ + 8))();
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_98.ss_.ptr_._0_4_ = 1 << ((byte)lVar4 & 0x1f);
        if (lVar4 == 3) {
          local_98.ss_.ptr_._0_4_ = 8;
        }
        testing::internal::CmpHelperEQ<aiPrimitiveType,unsigned_int>
                  ((internal *)&local_88,
                   "((n+1) > 3 ? aiPrimitiveType_POLYGON : (aiPrimitiveType)(1u << ((n+1)-1)))",
                   "mesh->mPrimitiveTypes",(aiPrimitiveType *)&local_98,&local_60->mPrimitiveTypes);
        if ((char)local_88._M_dataplus._M_p == '\0') {
          testing::Message::Message(&local_98);
          pcVar6 = "";
          if ((undefined8 *)local_88._M_string_length != (undefined8 *)0x0) {
            pcVar6 = *(char **)local_88._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_a0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utSortByPType.cpp"
                     ,0xc0,pcVar6);
          testing::internal::AssertHelper::operator=(&local_a0,&local_98);
          testing::internal::AssertHelper::~AssertHelper(&local_a0);
          if (((CONCAT44(local_98.ss_.ptr_._4_4_,(int)local_98.ss_.ptr_) != 0) &&
              (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
             ((long *)CONCAT44(local_98.ss_.ptr_._4_4_,(int)local_98.ss_.ptr_) != (long *)0x0)) {
            (**(code **)(*(long *)CONCAT44(local_98.ss_.ptr_._4_4_,(int)local_98.ss_.ptr_) + 8))();
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_88._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        bVar2 = local_60->mVertices == (aiVector3D *)0x0;
        iVar9 = (internal)!bVar2;
        local_90.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_98.ss_.ptr_._0_1_ = iVar9;
        if (bVar2) {
          testing::Message::Message((Message *)&local_a0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_88,(internal *)&local_98,(AssertionResult *)"NULL != mesh->mVertices",
                     "false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_68,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utSortByPType.cpp"
                     ,0xc1,(char *)CONCAT71(local_88._M_dataplus._M_p._1_7_,
                                            (char)local_88._M_dataplus._M_p));
          testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_a0);
          testing::internal::AssertHelper::~AssertHelper(&local_68);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_88._M_dataplus._M_p._1_7_,(char)local_88._M_dataplus._M_p) !=
              &local_88.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_88._M_dataplus._M_p._1_7_,(char)local_88._M_dataplus._M_p
                                    ));
          }
          if (((local_a0.data_ != (AssertHelperData *)0x0) &&
              (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
             (local_a0.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_a0.data_ + 8))();
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        bVar2 = local_60->mNormals == (aiVector3D *)0x0;
        local_98.ss_.ptr_._0_1_ = (internal)!bVar2;
        local_90.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (bVar2) {
          testing::Message::Message((Message *)&local_a0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_88,(internal *)&local_98,(AssertionResult *)"NULL != mesh->mNormals",
                     "false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_68,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utSortByPType.cpp"
                     ,0xc2,(char *)CONCAT71(local_88._M_dataplus._M_p._1_7_,
                                            (char)local_88._M_dataplus._M_p));
          testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_a0);
          testing::internal::AssertHelper::~AssertHelper(&local_68);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_88._M_dataplus._M_p._1_7_,(char)local_88._M_dataplus._M_p) !=
              &local_88.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_88._M_dataplus._M_p._1_7_,(char)local_88._M_dataplus._M_p
                                    ));
          }
          if (((local_a0.data_ != (AssertHelperData *)0x0) &&
              (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
             (local_a0.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_a0.data_ + 8))();
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        bVar2 = local_60->mTangents == (aiVector3D *)0x0;
        local_98.ss_.ptr_._0_1_ = (internal)!bVar2;
        local_90.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (bVar2) {
          testing::Message::Message((Message *)&local_a0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_88,(internal *)&local_98,(AssertionResult *)"NULL != mesh->mTangents",
                     "false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_68,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utSortByPType.cpp"
                     ,0xc3,(char *)CONCAT71(local_88._M_dataplus._M_p._1_7_,
                                            (char)local_88._M_dataplus._M_p));
          testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_a0);
          testing::internal::AssertHelper::~AssertHelper(&local_68);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_88._M_dataplus._M_p._1_7_,(char)local_88._M_dataplus._M_p) !=
              &local_88.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_88._M_dataplus._M_p._1_7_,(char)local_88._M_dataplus._M_p
                                    ));
          }
          if (((local_a0.data_ != (AssertHelperData *)0x0) &&
              (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
             (local_a0.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_a0.data_ + 8))();
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        bVar2 = local_60->mBitangents == (aiVector3D *)0x0;
        local_98.ss_.ptr_._0_1_ = (internal)!bVar2;
        local_90.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (bVar2) {
          testing::Message::Message((Message *)&local_a0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_88,(internal *)&local_98,(AssertionResult *)"NULL != mesh->mBitangents",
                     "false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_68,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utSortByPType.cpp"
                     ,0xc4,(char *)CONCAT71(local_88._M_dataplus._M_p._1_7_,
                                            (char)local_88._M_dataplus._M_p));
          testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_a0);
          testing::internal::AssertHelper::~AssertHelper(&local_68);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_88._M_dataplus._M_p._1_7_,(char)local_88._M_dataplus._M_p) !=
              &local_88.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_88._M_dataplus._M_p._1_7_,(char)local_88._M_dataplus._M_p
                                    ));
          }
          if (((local_a0.data_ != (AssertHelperData *)0x0) &&
              (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
             (local_a0.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_a0.data_ + 8))();
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        bVar2 = local_60->mTextureCoords[0] == (aiVector3D *)0x0;
        local_98.ss_.ptr_._0_1_ = (internal)!bVar2;
        local_90.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (bVar2) {
          testing::Message::Message((Message *)&local_a0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_88,(internal *)&local_98,
                     (AssertionResult *)"NULL != mesh->mTextureCoords[0]","false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_68,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utSortByPType.cpp"
                     ,0xc5,(char *)CONCAT71(local_88._M_dataplus._M_p._1_7_,
                                            (char)local_88._M_dataplus._M_p));
          testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_a0);
          testing::internal::AssertHelper::~AssertHelper(&local_68);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_88._M_dataplus._M_p._1_7_,(char)local_88._M_dataplus._M_p) !=
              &local_88.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_88._M_dataplus._M_p._1_7_,(char)local_88._M_dataplus._M_p
                                    ));
          }
          if (((local_a0.data_ != (AssertHelperData *)0x0) &&
              (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
             (local_a0.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_a0.data_ + 8))();
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        bVar2 = local_60->mNumFaces == uVar1;
        local_98.ss_.ptr_._0_4_ = CONCAT31(local_98.ss_.ptr_._1_3_,bVar2);
        local_90.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!bVar2) {
          testing::Message::Message((Message *)&local_a0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_88,(internal *)&local_98,(AssertionResult *)"mesh->mNumFaces == idx",
                     "false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_68,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utSortByPType.cpp"
                     ,199,(char *)CONCAT71(local_88._M_dataplus._M_p._1_7_,
                                           (char)local_88._M_dataplus._M_p));
          testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_a0);
          testing::internal::AssertHelper::~AssertHelper(&local_68);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_88._M_dataplus._M_p._1_7_,(char)local_88._M_dataplus._M_p) !=
              &local_88.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_88._M_dataplus._M_p._1_7_,(char)local_88._M_dataplus._M_p
                                    ));
          }
          if (((local_a0.data_ != (AssertHelperData *)0x0) &&
              (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
             (local_a0.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_a0.data_ + 8))();
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_4c = uVar3;
        if (local_60->mNumFaces != 0) {
          lVar8 = 0;
          uVar7 = 0;
          paVar5 = local_60;
          do {
            uVar3 = *(uint *)((long)&paVar5->mFaces->mNumIndices + lVar8);
            if (lVar4 + 1U == (ulong)uVar3) {
              local_98.ss_.ptr_._0_4_ = CONCAT31(local_98.ss_.ptr_._1_3_,1);
              local_90.ptr_ =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            }
            else {
              if (lVar4 == 3) {
                local_98.ss_.ptr_._0_4_ = CONCAT31(local_98.ss_.ptr_._1_3_,3 < uVar3);
                local_90.ptr_ =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                if (3 < uVar3) goto LAB_0038258f;
              }
              else {
                local_98.ss_.ptr_._0_4_ = (uint)local_98.ss_.ptr_._1_3_ << 8;
              }
              local_90.ptr_ =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              testing::Message::Message((Message *)&local_a0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&local_88,(internal *)&local_98,
                         (AssertionResult *)
                         "face.mNumIndices == (n+1) || (3 == n && face.mNumIndices > 3)","false",
                         "true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_68,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utSortByPType.cpp"
                         ,0xca,(char *)CONCAT71(local_88._M_dataplus._M_p._1_7_,
                                                (char)local_88._M_dataplus._M_p));
              testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_a0);
              testing::internal::AssertHelper::~AssertHelper(&local_68);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT71(local_88._M_dataplus._M_p._1_7_,(char)local_88._M_dataplus._M_p) !=
                  &local_88.field_2) {
                operator_delete((undefined1 *)
                                CONCAT71(local_88._M_dataplus._M_p._1_7_,
                                         (char)local_88._M_dataplus._M_p));
              }
              paVar5 = local_60;
              if (((local_a0.data_ != (AssertHelperData *)0x0) &&
                  (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
                 (local_a0.data_ != (AssertHelperData *)0x0)) {
                (**(code **)(*(long *)local_a0.data_ + 8))();
              }
            }
LAB_0038258f:
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_90,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            uVar7 = uVar7 + 1;
            lVar8 = lVar8 + 0x10;
          } while (uVar7 < paVar5->mNumFaces);
        }
        uVar3 = local_4c + 1;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    local_48 = local_48 + 1;
    if (local_48 == 10) {
      return;
    }
  } while( true );
}

Assistant:

TEST_F(SortByPTypeProcessTest, SortByPTypeStep) {
    ScenePreprocessor s(mScene);
    s.ProcessScene();
    for (unsigned int m = 0; m< 10;++m)
        EXPECT_EQ(result[m], mScene->mMeshes[m]->mPrimitiveTypes);

    mProcess1->Execute(mScene);

    unsigned int idx = 0;
    for (unsigned int m = 0,real = 0; m< 10;++m) {
        for (unsigned int n = 0; n < 4;++n) {
            if ((idx = num[m][n])) {
                EXPECT_TRUE(real < mScene->mNumMeshes);

                aiMesh* mesh = mScene->mMeshes[real];

                EXPECT_TRUE(NULL != mesh);
                EXPECT_EQ(AI_PRIMITIVE_TYPE_FOR_N_INDICES(n+1), mesh->mPrimitiveTypes);
                EXPECT_TRUE(NULL != mesh->mVertices);
                EXPECT_TRUE(NULL != mesh->mNormals);
                EXPECT_TRUE(NULL != mesh->mTangents);
                EXPECT_TRUE(NULL != mesh->mBitangents);
                EXPECT_TRUE(NULL != mesh->mTextureCoords[0]);

                EXPECT_TRUE(mesh->mNumFaces == idx);
                for (unsigned int f = 0; f < mesh->mNumFaces;++f) {
                    aiFace& face = mesh->mFaces[f];
                    EXPECT_TRUE(face.mNumIndices == (n+1) || (3 == n && face.mNumIndices > 3));
                }
                ++real;
            }
        }
    }
}